

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_update_decoder.cpp
# Opt level: O1

FieldDef *
bidfx_public_api::price::pixie::PriceUpdateDecoder::GetFieldDef
          (FieldDef *__return_storage_ptr__,ByteBuffer *buffer,IDataDictionary *data_dictionary,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
          *price_map,uint32_t fid)

{
  DecodingException *this;
  optional<bidfx_public_api::price::pixie::FieldDef> fieldDef;
  string local_78;
  FieldDef local_58;
  char local_28;
  
  (**data_dictionary->_vptr_IDataDictionary)(&local_58,data_dictionary,(ulong)fid);
  if (local_28 != '\0') {
    FieldDef::FieldDef(__return_storage_ptr__,&local_58);
    if (local_28 == '\x01') {
      local_28 = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.name_._M_dataplus._M_p != &local_58.name_.field_2) {
        operator_delete(local_58.name_._M_dataplus._M_p,
                        local_58.name_.field_2._M_allocated_capacity + 1);
      }
    }
    return __return_storage_ptr__;
  }
  this = (DecodingException *)__cxa_allocate_exception(0x28);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"attempted to get a field def which does not exist","");
  exceptions::DecodingException::DecodingException(this,&local_78);
  __cxa_throw(this,&exceptions::DecodingException::typeinfo,
              exceptions::BidFXException::~BidFXException);
}

Assistant:

FieldDef PriceUpdateDecoder::GetFieldDef(ByteBuffer& buffer, IDataDictionary& data_dictionary,
                                         std::map<std::string, PriceField>& price_map, uint32_t fid)
{
    std::optional<FieldDef> fieldDef = data_dictionary.FieldDefByFid(fid);
    if (!fieldDef)
    {
        throw DecodingException("attempted to get a field def which does not exist");
    }
    return *fieldDef;
}